

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpos.h
# Opt level: O0

uint32_t get_dist_slot_2(uint32_t dist)

{
  uint32_t local_c;
  uint32_t dist_local;
  
  if (0x7f < dist) {
    if (dist < 0x80000) {
      local_c = ""[dist >> 6] + 0xc;
    }
    else if (dist < 0x80000000) {
      local_c = ""[dist >> 0x12] + 0x24;
    }
    else {
      local_c = ""[dist >> 0x1e] + 0x3c;
    }
    return local_c;
  }
  __assert_fail("dist >= FULL_DISTANCES",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/fastpos.h"
                ,0x7f,"uint32_t get_dist_slot_2(uint32_t)");
}

Assistant:

static inline uint32_t
get_dist_slot_2(uint32_t dist)
{
	assert(dist >= FULL_DISTANCES);

	if (dist < fastpos_limit(FULL_DISTANCES_BITS - 1, 0))
		return fastpos_result(dist, FULL_DISTANCES_BITS - 1, 0);

	if (dist < fastpos_limit(FULL_DISTANCES_BITS - 1, 1))
		return fastpos_result(dist, FULL_DISTANCES_BITS - 1, 1);

	return fastpos_result(dist, FULL_DISTANCES_BITS - 1, 2);
}